

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int intCallback(uint user_gpio,uint edge,void *f,void *user,int ex)

{
  int iVar1;
  callback_t *pcVar2;
  void *in_RCX;
  CBF_t in_RDX;
  uint in_ESI;
  uint in_EDI;
  int in_R8D;
  callback_t *p;
  callback_t *local_30;
  int local_4;
  
  if (((in_EDI < 0x20) && (in_ESI < 3)) && (in_RDX != (CBF_t)0x0)) {
    for (local_30 = gCallBackFirst; local_30 != (callback_t *)0x0; local_30 = local_30->next) {
      if (((local_30->gpio == in_EDI) && (local_30->edge == in_ESI)) && (local_30->f == in_RDX)) {
        return -0x7d6;
      }
    }
    pcVar2 = (callback_t *)malloc(0x38);
    if (pcVar2 == (callback_t *)0x0) {
      local_4 = -0x7d7;
    }
    else {
      if (gCallBackFirst == (callback_t *)0x0) {
        gCallBackFirst = pcVar2;
      }
      iVar1 = intCallback::id + 1;
      pcVar2->id = intCallback::id;
      intCallback::id = iVar1;
      pcVar2->gpio = in_EDI;
      pcVar2->edge = in_ESI;
      pcVar2->f = in_RDX;
      pcVar2->user = in_RCX;
      pcVar2->ex = in_R8D;
      pcVar2->next = (callback_t *)0x0;
      pcVar2->prev = gCallBackLast;
      if (pcVar2->prev != (callback_t *)0x0) {
        pcVar2->prev->next = pcVar2;
      }
      gCallBackLast = pcVar2;
      findNotifyBits();
      local_4 = pcVar2->id;
    }
  }
  else {
    local_4 = -0x7d8;
  }
  return local_4;
}

Assistant:

static int intCallback(unsigned user_gpio, unsigned edge, void *f, void *user, int ex)
{
   static int id = 0;
   callback_t *p;

   if ((user_gpio >=0) && (user_gpio < 32) && (edge >=0) && (edge <= 2) && f)
   {
      /* prevent duplicates */

      p = gCallBackFirst;

      while (p)
      {
         if ((p->gpio == user_gpio) && (p->edge == edge) && (p->f == f))
         {
            return pigif_duplicate_callback;
         }
         p = p->next;
      }

      p = malloc(sizeof(callback_t));

      if (p)
      {
         if (!gCallBackFirst) gCallBackFirst = p;

         p->id = id++;
         p->gpio = user_gpio;
         p->edge = edge;
         p->f = f;
         p->user = user;
         p->ex = ex;
         p->next = 0;
         p->prev = gCallBackLast;

         if (p->prev) (p->prev)->next = p;
         gCallBackLast = p;

         findNotifyBits();

         return p->id;
      }

      return pigif_bad_malloc;
   }

   return pigif_bad_callback;
}